

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

bool __thiscall Regex::processSubTree(Regex *this,Element *cur_node,ParseData *data)

{
  bool bVar1;
  bool done;
  Element *top_node;
  ParseData *data_local;
  Element *cur_node_local;
  Regex *this_local;
  
  data_local = (ParseData *)cur_node;
  while( true ) {
    if (data_local == (ParseData *)0x0) {
      return true;
    }
    bVar1 = processElement(this,(Element *)data_local,data);
    if (!bVar1) break;
    if (((*(int *)((long)&(data_local->string).field_2 + 8) == 4) ||
        (*(int *)((long)&(data_local->string).field_2 + 8) == 2)) ||
       ((data_local->string).field_2._M_allocated_capacity == 0)) {
      if ((data_local->string)._M_string_length == 0) {
        bVar1 = false;
        while (!bVar1) {
          if (cur_node == *(Element **)&data_local->string) {
            bVar1 = true;
            data_local = (ParseData *)0x0;
          }
          else {
            data_local = *(ParseData **)&data_local->string;
            if ((data_local->string)._M_string_length != 0) {
              data_local = (ParseData *)(data_local->string)._M_string_length;
              bVar1 = true;
            }
          }
        }
      }
      else {
        data_local = (ParseData *)(data_local->string)._M_string_length;
      }
    }
    else {
      data_local = (ParseData *)(data_local->string).field_2._M_allocated_capacity;
    }
  }
  return false;
}

Assistant:

bool	Regex::processSubTree( Element *cur_node, ParseData *data )
{
	Element *top_node = cur_node;
	
	while( cur_node != NULL )
	{
		if ( processElement( cur_node, data ) == false )
			return false;
		
		if ( cur_node->mType != TYPE_CLASS && cur_node->mType != TYPE_OR && cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( top_node == cur_node->mParent )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return true;
}